

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O3

int dmy_to_mjd2000(int D,int M,int Y,int *mjd2000)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int local_34;
  
  iVar1 = dmy_to_mjd2000_julian(D,M,Y,&local_34);
  iVar4 = -1;
  if (iVar1 != 0) {
    return -1;
  }
  if (local_34 < 0x240786) {
    local_34 = local_34 + -0x256859;
LAB_00130996:
    *mjd2000 = local_34;
    iVar4 = 0;
  }
  else {
    if (((0 < D) && (Y != 0)) && (0xfffffff3 < M - 0xdU)) {
      uVar2 = 0;
      if (M == 2) {
        uVar2 = Y - (Y >> 0x1f);
        uVar3 = uVar2 * -0x3d70a3d7 + 0x51eb850;
        uVar2 = (uint)((uVar3 >> 4 | uVar2 * -0x70000000) < 0xa3d70b !=
                      ((uVar3 >> 2 | uVar2 * 0x40000000) < 0x28f5c29 != ((uVar2 & 3) == 0)));
      }
      if (D <= (int)((*(int *)(&DAT_001919b0 + (ulong)(uint)M * 4) -
                     *(int *)(&DAT_001919b0 + (ulong)(M - 1) * 4)) + uVar2)) {
        iVar1 = -(Y >> 0x1f);
        uVar2 = iVar1 + Y;
        uVar3 = iVar1 + Y + 3;
        if (-1 < (int)uVar2) {
          uVar3 = uVar2;
        }
        iVar1 = (int)((ulong)((long)(int)uVar2 * -0x51eb851f) >> 0x20);
        local_34 = 0;
        if ((uint)M < 3) {
          local_34 = -(uint)((uint)((uVar2 & 3) == 0) - (uint)((int)uVar2 % 100 == 0) !=
                            -(uint)((int)uVar2 % 400 == 0));
        }
        local_34 = local_34 +
                   (((int)(uVar2 - (uVar3 & 0xfffffffc)) >> 0x1f) - ((int)uVar2 % 100 >> 0x1f)) +
                   ((iVar1 >> 5) - (iVar1 >> 0x1f)) + ((int)uVar3 >> 2) + (int)uVar2 / 400 + D +
                   uVar2 * 0x16d + ((int)uVar2 % 400 >> 0x1f) +
                   *(int *)(&DAT_001919b0 + (ulong)(M - 1) * 4);
        if (0xecc2 < local_34 + -0x8d7df) {
          local_34 = local_34 + -0xb2575;
          goto LAB_00130996;
        }
      }
    }
    coda_set_error(-0x68,"invalid date/time argument (%02d-%02d-%04d)",D,(ulong)(uint)M,
                   (ulong)(uint)Y);
  }
  return iVar4;
}

Assistant:

static int dmy_to_mjd2000(int D, int M, int Y, int *mjd2000)
{
    const int TD = 2;
    const int TM = 9;
    const int TY = 1752;
    int transition;
    int the_date;

    if (dmy_to_mjd2000_julian(D, M, Y, &the_date) != 0 || dmy_to_mjd2000_julian(TD, TM, TY, &transition) != 0)
    {
        return -1;
    }

    if (the_date <= transition)
    {
        /* Julian calendar regime */
        *mjd2000 = the_date - 2451545;
    }
    else
    {
        /* Gregorian calendar regime */
        if (dmy_to_mjd2000_gregorian(D, M, Y, &the_date) != 0)
        {
            return -1;
        }

        if (the_date - 150934 <= transition - 2451545)
        {
            coda_set_error(CODA_ERROR_INVALID_DATETIME, "invalid date/time argument (%02d-%02d-%04d)", D, M, Y);
            return -1;
        }

        *mjd2000 = the_date - 150934;
    }

    return 0;
}